

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swipe.cc
# Opt level: O0

vector sptk::swipe::swipe(vector<double,_std::allocator<double>_> *waveform,double samplerate,
                         double min,double max,double st,double dt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  __type _Var5;
  __type _Var6;
  intvector yr_vector;
  vector yr_vector_00;
  vector yr_vector_01;
  vector pc_00;
  matrix S_00;
  vector pc_01;
  vector x_00;
  vector x_01;
  matrix S_01;
  vector pc_02;
  matrix S_02;
  vector x_02;
  vector fERBs_00;
  vector fERBs_01;
  vector d_00;
  vector d_01;
  intvector ws_00;
  vector fERBs_02;
  intvector ws_01;
  intvector ps_00;
  vector d_02;
  intvector ps_01;
  intvector ws_02;
  intvector ps_02;
  int iVar7;
  int iVar8;
  size_type sVar11;
  int iVar9;
  int iVar10;
  const_reference pvVar12;
  double *nyquist_00;
  vector<double,_std::allocator<double>_> *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM4_Qa;
  intvector iVar17;
  vector vVar18;
  vector vVar19;
  vector vVar20;
  intvector iVar21;
  matrix mVar22;
  vector vVar23;
  matrix S;
  intvector ps;
  vector fERBs;
  vector x;
  int frames;
  double n;
  vector d;
  vector pc;
  intvector ws;
  double nyquist16;
  double nyquist2;
  double nyquist;
  double td;
  int i;
  vector p;
  double in_stack_fffffffffffffc88;
  undefined8 uVar24;
  int in_stack_fffffffffffffc90;
  undefined4 uVar25;
  int in_stack_fffffffffffffc94;
  undefined4 uVar26;
  undefined8 in_stack_fffffffffffffc98;
  int *in_stack_fffffffffffffca0;
  undefined8 uVar27;
  undefined8 uVar28;
  double *in_stack_fffffffffffffe10;
  double in_stack_fffffffffffffe18;
  double **in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  double *in_stack_fffffffffffffe30;
  double in_stack_fffffffffffffe38;
  double *in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  double **in_stack_fffffffffffffe50;
  double *pdVar29;
  double *pdVar30;
  double **ppdVar31;
  double *pdVar32;
  double *pdVar33;
  double *pdVar34;
  double *pdVar35;
  double *pdVar36;
  int n_00;
  int *piVar37;
  double *pdVar38;
  int *local_118;
  double **ppdStack_110;
  undefined4 uStack_f4;
  undefined4 uStack_e4;
  undefined4 uStack_d4;
  undefined4 uStack_b4;
  undefined4 uStack_a4;
  undefined4 uStack_94;
  int local_64;
  double local_60;
  double local_50;
  double **ppdVar13;
  double **ppdVar14;
  double *st_00;
  double *pdVar15;
  double *pdVar16;
  
  dVar1 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  dVar2 = dVar1 / 2.0;
  dVar3 = dVar1 * 8.0;
  local_50 = in_XMM2_Qa;
  if (dVar2 < in_XMM2_Qa) {
    fprintf(_stderr,"Max pitch exceeds Nyquist frequency...");
    fprintf(_stderr,"max pitch set to %.2f Hz.\n",SUB84(dVar2,0));
    local_50 = dVar2;
  }
  local_60 = in_XMM4_Qa;
  if (dVar1 < in_XMM4_Qa) {
    fprintf(_stderr,"Timestep > SR...timestep set to %f.\n",in_XMM0_Da);
    local_60 = dVar1;
  }
  dVar2 = log2(dVar3 / in_XMM1_Qa);
  dVar4 = log2(dVar3 / local_50);
  round(dVar2 - dVar4);
  iVar17 = makeiv(0);
  ppdVar13 = (double **)iVar17.v;
  iVar7 = iVar17.x;
  for (local_64 = 0; local_64 < iVar7; local_64 = local_64 + 1) {
    dVar2 = log2(dVar3 / in_XMM1_Qa);
    round(dVar2);
    _Var5 = std::pow<int,double>(in_stack_fffffffffffffc94,in_stack_fffffffffffffc88);
    _Var6 = std::pow<int,int>(0,0x1326a0);
    *(int *)((long)ppdVar13 + (long)local_64 * 4) = (int)(_Var5 / _Var6);
  }
  dVar2 = log2(local_50);
  dVar4 = log2(in_XMM1_Qa);
  ceil((dVar2 - dVar4) / 0.0104167);
  vVar18 = makev(0);
  ppdVar14 = (double **)vVar18.v;
  iVar8 = vVar18.x;
  vVar19 = makev(0);
  st_00 = vVar19.v;
  local_64 = iVar8;
  while (local_64 = local_64 + -1, -1 < local_64) {
    dVar2 = log2(in_XMM1_Qa);
    pdVar15 = (double *)std::pow<int,double>(in_stack_fffffffffffffc94,in_stack_fffffffffffffc88);
    ppdVar14[local_64] = pdVar15;
    dVar4 = log2(dVar3 / (double)*(int *)ppdVar13);
    st_00[local_64] = ((double)local_64 * 0.0104167 + dVar2 + 1.0) - dVar4;
  }
  sVar11 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
  vVar20 = makev(0);
  pdVar15 = vVar20.v;
  iVar9 = vVar20.x;
  for (local_64 = 0; local_64 < (int)sVar11; local_64 = local_64 + 1) {
    pvVar12 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)local_64);
    pdVar15[local_64] = *pvVar12 * 3.0517578125e-05;
  }
  dVar2 = hz2erb(6.2037599852879e-318);
  std::pow<int,double>(in_stack_fffffffffffffc94,in_stack_fffffffffffffc88);
  dVar3 = hz2erb(6.20396749285916e-318);
  ceil((dVar2 - dVar3) / 0.1);
  vVar20 = makev(0);
  nyquist_00 = vVar20.v;
  iVar10 = vVar20.x;
  hz2erb(6.20436274537583e-318);
  for (local_64 = 0; local_64 < iVar10; local_64 = local_64 + 1) {
    dVar2 = erb2hz(6.20473329461021e-318);
    nyquist_00[local_64] = dVar2;
  }
  floor(nyquist_00[iVar10 + -1] / (double)*ppdVar14 - 0.75);
  iVar21 = onesiv(0);
  pdVar16 = (double *)iVar21.v;
  iVar17.v = in_stack_fffffffffffffca0;
  iVar17._0_8_ = in_stack_fffffffffffffc98;
  sieve(iVar17);
  *(undefined4 *)pdVar16 = 1;
  ceil(((double)iVar9 / dVar1) / local_60);
  mVar22 = zerom(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90);
  local_118 = mVar22._0_8_;
  ppdStack_110 = mVar22.m;
  piVar37 = (int *)CONCAT44(uStack_d4,iVar9);
  pdVar36 = (double *)CONCAT44(uStack_a4,iVar8);
  n_00 = (int)vVar18.v;
  uVar25 = vVar18.v._4_4_;
  pdVar34 = (double *)CONCAT44(uStack_e4,iVar10);
  pdVar32 = (double *)CONCAT44(uStack_b4,vVar19.x);
  pdVar30 = (double *)CONCAT44(uStack_94,iVar7);
  S_01.m = in_stack_fffffffffffffe50;
  S_01.x = (int)in_stack_fffffffffffffe48;
  S_01.y = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  x_00.v = in_stack_fffffffffffffe40;
  x_00._0_8_ = in_stack_fffffffffffffe38;
  vVar18.v = in_stack_fffffffffffffe30;
  vVar18._0_8_ = in_stack_fffffffffffffe28;
  fERBs_00.v = pdVar30;
  fERBs_00._0_8_ = pdVar16;
  d_00.v = pdVar32;
  d_00._0_8_ = ppdVar13;
  ws_00.v = (int *)pdVar34;
  ws_00._0_8_ = st_00;
  ps_00.v = (int *)pdVar36;
  ps_00._0_8_ = nyquist_00;
  pdVar29 = pdVar16;
  ppdVar31 = ppdVar13;
  pdVar33 = st_00;
  pdVar35 = nyquist_00;
  pdVar38 = pdVar15;
  Sfirst(S_01,x_00,vVar18,fERBs_00,d_00,ws_00,ps_00,(double)in_stack_fffffffffffffe20,
         in_stack_fffffffffffffe18,(double)in_stack_fffffffffffffe10,n_00);
  for (local_64 = 1; local_64 < iVar7 + -1; local_64 = local_64 + 1) {
    x_02._4_4_ = uStack_d4;
    x_02.x = iVar9;
    in_stack_fffffffffffffe48 = CONCAT44(uStack_a4,iVar8);
    in_stack_fffffffffffffe38 = (double)CONCAT44(uStack_e4,iVar10);
    in_stack_fffffffffffffe28 = CONCAT44(uStack_b4,vVar19.x);
    in_stack_fffffffffffffe18 = (double)CONCAT44(uStack_94,iVar7);
    x_02.v = pdVar15;
    pc_02.v = (double *)ppdVar14;
    pc_02._0_8_ = in_stack_fffffffffffffe48;
    fERBs_02.v = pdVar34;
    fERBs_02._0_8_ = pdVar33;
    d_02.v = pdVar36;
    d_02._0_8_ = pdVar35;
    ws_02._4_4_ = uVar25;
    ws_02.x = n_00;
    ws_02.v = piVar37;
    ps_02.v = local_118;
    ps_02._0_8_ = pdVar38;
    in_stack_fffffffffffffe10 = pdVar16;
    in_stack_fffffffffffffe20 = ppdVar13;
    in_stack_fffffffffffffe30 = st_00;
    in_stack_fffffffffffffe40 = nyquist_00;
    in_stack_fffffffffffffe50 = ppdVar14;
    Snth(mVar22,x_02,pc_02,fERBs_02,d_02,ws_02,ps_02,(double)nyquist_00,in_stack_fffffffffffffe38,
         (double)st_00,(int)ppdStack_110);
  }
  uVar24 = CONCAT44(uStack_e4,iVar10);
  uVar25 = vVar20.v._0_4_;
  uVar26 = vVar20.v._4_4_;
  S_02.m = in_stack_fffffffffffffe50;
  S_02.x = (int)in_stack_fffffffffffffe48;
  S_02.y = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  x_01.v = in_stack_fffffffffffffe40;
  x_01._0_8_ = in_stack_fffffffffffffe38;
  pc_01.v = in_stack_fffffffffffffe30;
  pc_01._0_8_ = in_stack_fffffffffffffe28;
  fERBs_01.v = pdVar30;
  fERBs_01._0_8_ = pdVar29;
  d_01.v = pdVar32;
  d_01._0_8_ = ppdVar31;
  ws_01.v = (int *)pdVar34;
  ws_01._0_8_ = pdVar33;
  ps_01.v = (int *)pdVar36;
  ps_01._0_8_ = pdVar35;
  Slast(S_02,x_01,pc_01,fERBs_01,d_01,ws_01,ps_01,(double)in_stack_fffffffffffffe20,
        in_stack_fffffffffffffe18,(double)in_stack_fffffffffffffe10,n_00);
  vVar19.v._0_4_ = uVar25;
  vVar19._0_8_ = uVar24;
  vVar19.v._4_4_ = uVar26;
  freev(vVar19);
  uVar28 = CONCAT44(uStack_94,iVar7);
  yr_vector.v._0_4_ = uVar25;
  yr_vector._0_8_ = uVar24;
  yr_vector.v._4_4_ = uVar26;
  freeiv(yr_vector);
  uVar27 = CONCAT44(uStack_f4,iVar21.x);
  iVar21.v._0_4_ = uVar25;
  iVar21._0_8_ = uVar24;
  iVar21.v._4_4_ = uVar26;
  freeiv(iVar21);
  vVar20.v._0_4_ = uVar25;
  vVar20._0_8_ = uVar24;
  vVar20.v._4_4_ = uVar26;
  freev(vVar20);
  yr_vector_00.v._0_4_ = uVar25;
  yr_vector_00._0_8_ = uVar24;
  yr_vector_00.v._4_4_ = uVar26;
  freev(yr_vector_00);
  S_00.m = ppdVar13;
  S_00.x = (int)uVar28;
  S_00.y = (int)((ulong)uVar28 >> 0x20);
  pc_00.v = pdVar16;
  pc_00._0_8_ = uVar27;
  vVar18 = pitch(S_00,pc_00,(double)st_00);
  vVar23.v = vVar18.v;
  vVar23.x = vVar18.x;
  yr_vector_01.v._0_4_ = uVar25;
  yr_vector_01._0_8_ = uVar24;
  yr_vector_01.v._4_4_ = uVar26;
  freev(yr_vector_01);
  mVar22.m._0_4_ = uVar25;
  mVar22.x = (int)uVar24;
  mVar22.y = (int)((ulong)uVar24 >> 0x20);
  mVar22.m._4_4_ = uVar26;
  freem(mVar22);
  vVar23._4_4_ = 0;
  return vVar23;
}

Assistant:

vector swipe(const std::vector<double>& waveform, double samplerate, double min,
             double max, double st, double dt) {
#endif
    int i; 
    double td = 0.;
#if 0
    SF_INFO info;
    SNDFILE* source = sf_open_fd(fid, SFM_READ, &info, true);
    if (source == NULL || info.sections < 1) 
        return(makev(0)); 
    double nyquist = info.samplerate / 2.;
    double nyquist2 = info.samplerate;
    double nyquist16 = info.samplerate * 8.;
#else
    double nyquist = samplerate / 2.;
    double nyquist2 = samplerate;
    double nyquist16 = samplerate * 8.;
#endif
    if (max > nyquist) {
        max = nyquist;
        fprintf(stderr, "Max pitch exceeds Nyquist frequency...");
        fprintf(stderr, "max pitch set to %.2f Hz.\n", max);
    }
    if (dt > nyquist2) {
        dt = nyquist2;
        fprintf(stderr, "Timestep > SR...timestep set to %f.\n", nyquist2);
    }
    intvector ws = makeiv(round(log2((nyquist16) / min) -  
                                log2((nyquist16) / max)) + 1); 
    for (i = 0; i < ws.x; i++)
        ws.v[i] = pow(2, round(log2(nyquist16 / min))) / pow(2, i);
    vector pc = makev(ceil((log2(max) - log2(min)) / DLOG2P));
    vector d = makev(pc.x);
    for (i = pc.x - 1; i >= 0; i--) { 
        td = log2(min) + (i * DLOG2P);
        pc.v[i] = pow(2, td);
        d.v[i] = 1. + td - log2(nyquist16 / ws.v[0]); 
    } // td now equals log2(min)
#if 0
    vector x = makev((int) info.frames); // read in the signal
    sf_read_double(source, x.v, x.x);
    sf_close(source); // takes wavf with it, too
#else
    double n = 1. / 32768.;
    int frames = static_cast<int>(waveform.size());
    vector x = makev(frames);
    for (i = 0; i < frames; i++)
        x.v[i] = waveform[i] * n;
#endif
    vector fERBs = makev(ceil((hz2erb(nyquist) - 
                               hz2erb(pow(2, td) / 4)) / DERBS));
    td = hz2erb(min / 4.);
    for (i = 0; i < fERBs.x; i++) 
        fERBs.v[i] = erb2hz(td + (i * DERBS));
    intvector ps = onesiv(floor(fERBs.v[fERBs.x - 1] / pc.v[0] - .75));
    sieve(ps);
    ps.v[0] = PR; // hack to make 1 "act" prime...don't ask
    matrix S = zerom(pc.x, ceil(((double) x.x / nyquist2) / dt));
    Sfirst(S, x, pc, fERBs, d, ws, ps, nyquist, nyquist2, dt, 0); 
    for (i = 1; i < ws.x - 1; i++) // S is updated inline here
        Snth(S, x, pc, fERBs, d, ws, ps, nyquist, nyquist2, dt, i);
    // i is now (ws.x - 1)
    Slast(S, x, pc, fERBs, d, ws, ps, nyquist, nyquist2, dt, i);
    freev(fERBs); 
    freeiv(ws);
    freeiv(ps);
    freev(d);  
    freev(x);
    vector p = pitch(S, pc, st); // find pitch using strength matrix
    freev(pc);
    freem(S);
    return(p);
}